

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_GameCommand.cpp
# Opt level: O1

void __thiscall RenX::GameCommand::~GameCommand(GameCommand *this)

{
  pointer __dest;
  Core *this_00;
  pointer ppGVar1;
  size_t sVar2;
  Server *this_01;
  size_t server_index;
  size_t index;
  pointer __src;
  string_view trigger;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_0015c210;
  this_00 = getCore();
  ppGVar1 = g_GameMasterCommandList.
            super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __dest = g_GameMasterCommandList.
           super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (ppGVar1 ==
        g_GameMasterCommandList.
        super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001255d6;
    __src = __dest + 1;
    if (*ppGVar1 == this) break;
    ppGVar1 = ppGVar1 + 1;
    __dest = __src;
  }
  for (index = 0; sVar2 = Core::getServerCount(this_00), index != sVar2; index = index + 1) {
    this_01 = Core::getServer(this_00,index);
    if (this_01 != (Server *)0x0) {
      trigger = (string_view)Jupiter::Command::getTrigger((ulong)this);
      Server::removeCommand(this_01,trigger);
    }
  }
  if (__src != g_GameMasterCommandList.
               super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl
               .super__Vector_impl_data._M_finish) {
    memmove(__dest,__src,
            (long)g_GameMasterCommandList.
                  super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)__src);
  }
  g_GameMasterCommandList.
  super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       g_GameMasterCommandList.
       super__Vector_base<RenX::GameCommand_*,_std::allocator<RenX::GameCommand_*>_>._M_impl.
       super__Vector_impl_data._M_finish + -1;
LAB_001255d6:
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_0015c2d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_Command).m_triggers);
  return;
}

Assistant:

RenX::GameCommand::~GameCommand() {
	RenX::Core *core = RenX::getCore();
	for (auto itr = RenX::GameMasterCommandList.begin(); itr != RenX::GameMasterCommandList.end(); ++itr) {
		if (*itr == this) {
			RenX::Server *server;
			for (size_t server_index = 0; server_index != core->getServerCount(); ++server_index) {
				server = core->getServer(server_index);
				if (server != nullptr) {
					server->removeCommand(this->getTrigger());
				}
			}

			RenX::GameMasterCommandList.erase(itr);
			break;
		}
	}
}